

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecifySymbols.cpp
# Opt level: O3

void __thiscall
slang::ast::PulseStyleSymbol::checkPreviouslyUsed
          (PulseStyleSymbol *this,TimingPathMap *timingPathMap)

{
  pointer ppEVar1;
  group_type_pointer pgVar2;
  undefined4 uVar3;
  Scope *this_00;
  SyntaxNode *pSVar4;
  size_t sVar5;
  Expression *this_01;
  value_type_pointer ppVar6;
  ulong uVar7;
  TimingPathSymbol *this_02;
  pointer ppEVar8;
  Expression *this_03;
  uint uVar9;
  undefined1 auVar10 [16];
  byte bVar11;
  Symbol *pSVar12;
  ulong uVar13;
  long lVar14;
  Symbol *pSVar15;
  Diagnostic *this_04;
  ulong uVar16;
  SourceLocation SVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  pointer ppEVar21;
  uchar uVar22;
  uchar uVar23;
  uchar uVar24;
  byte bVar25;
  undefined1 auVar26 [16];
  iterator iVar27;
  string_view arg;
  SourceRange range;
  SourceLocation local_70;
  
  this_00 = (this->super_Symbol).parentScope;
  pSVar4 = (this->super_Symbol).originatingSyntax;
  if (this->isResolved == false) {
    resolve(this);
  }
  sVar5 = (this->terminals)._M_extent._M_extent_value;
  if (sVar5 == 0) {
    return;
  }
  ppEVar21 = (this->terminals)._M_ptr;
  ppEVar1 = ppEVar21 + sVar5;
LAB_0037511f:
  this_01 = *ppEVar21;
  pSVar12 = Expression::getSymbolReference(this_01,true);
  if (pSVar12 != (Symbol *)0x0) {
    auVar10._8_8_ = 0;
    auVar10._0_8_ = pSVar12;
    uVar16 = SUB168(auVar10 * ZEXT816(0x9e3779b97f4a7c15),8) ^
             SUB168(auVar10 * ZEXT816(0x9e3779b97f4a7c15),0);
    uVar13 = uVar16 >> ((byte)(timingPathMap->table_).
                              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_boost::unordered::unordered_flat_map<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*>,_slang::hash<const_slang::ast::Symbol_*>_>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_boost::unordered::unordered_flat_map<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*>,_slang::hash<const_slang::ast::Symbol_*>_>_>_>_>
                              .arrays.groups_size_index & 0x3f);
    uVar3 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word)[uVar16 & 0xff];
    ppVar6 = (timingPathMap->table_).
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_boost::unordered::unordered_flat_map<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*>,_slang::hash<const_slang::ast::Symbol_*>_>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_boost::unordered::unordered_flat_map<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*>,_slang::hash<const_slang::ast::Symbol_*>_>_>_>_>
             .arrays.elements_;
    uVar7 = (timingPathMap->table_).
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_boost::unordered::unordered_flat_map<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*>,_slang::hash<const_slang::ast::Symbol_*>_>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_boost::unordered::unordered_flat_map<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*>,_slang::hash<const_slang::ast::Symbol_*>_>_>_>_>
            .arrays.groups_size_mask;
    uVar18 = 0;
    do {
      pgVar2 = (timingPathMap->table_).
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_boost::unordered::unordered_flat_map<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*>,_slang::hash<const_slang::ast::Symbol_*>_>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_boost::unordered::unordered_flat_map<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*>,_slang::hash<const_slang::ast::Symbol_*>_>_>_>_>
               .arrays.groups_ + uVar13;
      bVar11 = pgVar2->m[0xf].n;
      uVar22 = (uchar)uVar3;
      auVar26[0] = -(pgVar2->m[0].n == uVar22);
      uVar23 = (uchar)((uint)uVar3 >> 8);
      auVar26[1] = -(pgVar2->m[1].n == uVar23);
      uVar24 = (uchar)((uint)uVar3 >> 0x10);
      auVar26[2] = -(pgVar2->m[2].n == uVar24);
      bVar25 = (byte)((uint)uVar3 >> 0x18);
      auVar26[3] = -(pgVar2->m[3].n == bVar25);
      auVar26[4] = -(pgVar2->m[4].n == uVar22);
      auVar26[5] = -(pgVar2->m[5].n == uVar23);
      auVar26[6] = -(pgVar2->m[6].n == uVar24);
      auVar26[7] = -(pgVar2->m[7].n == bVar25);
      auVar26[8] = -(pgVar2->m[8].n == uVar22);
      auVar26[9] = -(pgVar2->m[9].n == uVar23);
      auVar26[10] = -(pgVar2->m[10].n == uVar24);
      auVar26[0xb] = -(pgVar2->m[0xb].n == bVar25);
      auVar26[0xc] = -(pgVar2->m[0xc].n == uVar22);
      auVar26[0xd] = -(pgVar2->m[0xd].n == uVar23);
      auVar26[0xe] = -(pgVar2->m[0xe].n == uVar24);
      auVar26[0xf] = -(bVar11 == bVar25);
      for (uVar19 = (uint)(ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe); uVar19 != 0;
          uVar19 = uVar19 - 1 & uVar19) {
        uVar9 = 0;
        if (uVar19 != 0) {
          for (; (uVar19 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
          }
        }
        uVar20 = (ulong)uVar9;
        if (pSVar12 == ppVar6[uVar13 * 0xf + uVar20].first) {
          if (ppVar6[uVar13 * 0xf + uVar20].second.table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::vector<const_slang::ast::TimingPathSymbol_*>_>_>_>
              .size_ctrl.size == 0) goto LAB_003751fc;
          iVar27 = boost::unordered::detail::foa::
                   table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::vector<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>_>_>_>
                   ::begin(&ppVar6[uVar13 * 0xf + uVar20].second.table_);
          if (((iVar27.p_)->second).
              super__Vector_base<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              ((iVar27.p_)->second).
              super__Vector_base<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>
              ._M_impl.super__Vector_impl_data._M_finish) goto LAB_003751fc;
          iVar27 = boost::unordered::detail::foa::
                   table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::vector<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>_>_>_>
                   ::begin(&ppVar6[uVar13 * 0xf + uVar20].second.table_);
          this_02 = *((iVar27.p_)->second).
                     super__Vector_base<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          if (this_02->isResolved == false) {
            TimingPathSymbol::resolve(this_02);
          }
          sVar5 = (this_02->outputs)._M_extent._M_extent_value;
          if (sVar5 == 0) goto LAB_0037528c;
          ppEVar8 = (this_02->outputs)._M_ptr;
          lVar14 = 0;
          goto LAB_00375261;
        }
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)uVar16 & 7] & bVar11) == 0) break;
      lVar14 = uVar13 + uVar18;
      uVar18 = uVar18 + 1;
      uVar13 = lVar14 + 1U & uVar7;
    } while (uVar18 <= uVar7);
  }
  goto LAB_003751fc;
  while (lVar14 = lVar14 + 8, sVar5 << 3 != lVar14) {
LAB_00375261:
    this_03 = *(Expression **)((long)ppEVar8 + lVar14);
    pSVar15 = Expression::getSymbolReference(this_03,true);
    if (pSVar15 == pSVar12) {
      local_70 = (this_03->sourceRange).startLoc;
      SVar17 = (this_03->sourceRange).endLoc;
      goto LAB_003752ab;
    }
  }
LAB_0037528c:
  local_70 = (SourceLocation)0x0;
  SVar17 = (SourceLocation)0x0;
LAB_003752ab:
  this_04 = Scope::addDiag(this_00,(DiagCode)0xf20006,this_01->sourceRange);
  arg = parsing::Token::valueText((Token *)&pSVar4[3].parent);
  Diagnostic::operator<<(this_04,arg);
  Diagnostic::operator<<(this_04,pSVar12->name);
  range.endLoc = SVar17;
  range.startLoc = local_70;
  Diagnostic::addNote(this_04,(DiagCode)0x50001,range);
LAB_003751fc:
  ppEVar21 = ppEVar21 + 1;
  if (ppEVar21 == ppEVar1) {
    return;
  }
  goto LAB_0037511f;
}

Assistant:

void PulseStyleSymbol::checkPreviouslyUsed(const TimingPathMap& timingPathMap) const {
    auto parent = getParentScope();
    auto syntax = getSyntax();
    SLANG_ASSERT(parent && syntax);

    for (auto terminal : getTerminals()) {
        if (auto symbol = terminal->getSymbolReference()) {
            if (auto it = timingPathMap.find(symbol); it != timingPathMap.end()) {
                if (!it->second.empty() && !it->second.begin()->second.empty()) {
                    SourceRange pathRange;
                    auto first = it->second.begin()->second.front();
                    for (auto outputExpr : first->getOutputs()) {
                        if (outputExpr->getSymbolReference() == symbol) {
                            pathRange = outputExpr->sourceRange;
                            break;
                        }
                    }

                    SLANG_ASSERT(pathRange != SourceRange());

                    auto& diag = parent->addDiag(diag::InvalidPulseStyle, terminal->sourceRange);
                    diag << syntax->as<PulseStyleDeclarationSyntax>().keyword.valueText();
                    diag << symbol->name;
                    diag.addNote(diag::NoteDeclarationHere, pathRange);
                }
            }
        }
    }
}